

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::ClockingEventExpression::fromSyntax
          (ClockingEventExpression *this,ClockingPropertyExprSyntax *syntax,ASTContext *argContext)

{
  Compilation *this_00;
  SourceLocation this_01;
  Type *args;
  int iVar1;
  undefined4 extraout_var;
  ClockingEventExpression *pCVar2;
  SourceRange sourceRange;
  ASTContext context;
  SourceRange local_68;
  undefined1 local_58 [16];
  bitmask<slang::ast::ASTFlags> local_48;
  Symbol *pSStack_40;
  TempVarSymbol *local_38;
  RandomizeDetails *pRStack_30;
  AssertionInstanceDetails *local_28;
  
  local_58._0_8_ = *(undefined8 *)&(syntax->super_PropertyExprSyntax).super_SyntaxNode;
  local_58._8_8_ = (syntax->super_PropertyExprSyntax).super_SyntaxNode.parent;
  local_38 = (TempVarSymbol *)syntax->expr;
  pRStack_30 = *(RandomizeDetails **)&syntax[1].super_PropertyExprSyntax.super_SyntaxNode;
  local_28 = (AssertionInstanceDetails *)syntax[1].super_PropertyExprSyntax.super_SyntaxNode.parent;
  pSStack_40 = (Symbol *)0x0;
  local_48.m_bits = (ulong)(syntax->super_PropertyExprSyntax).super_SyntaxNode.previewNode | 0x20;
  this_00 = ((Scope *)local_58._0_8_)->compilation;
  iVar1 = TimingControl::bind((int)(this->super_Expression).syntax,(sockaddr *)local_58,
                              (socklen_t)argContext);
  this_01 = (this->super_Expression).sourceRange.startLoc;
  if (this_01 != (SourceLocation)0x0) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_01);
    ASTContext::addDiag((ASTContext *)local_58,(DiagCode)0xa30007,sourceRange);
  }
  args = this_00->voidType;
  local_68 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
  pCVar2 = BumpAllocator::
           emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange>
                     (&this_00->super_BumpAllocator,args,
                      (TimingControl *)CONCAT44(extraout_var,iVar1),&local_68);
  return &pCVar2->super_Expression;
}

Assistant:

Expression& ClockingEventExpression::fromSyntax(const ClockingPropertyExprSyntax& syntax,
                                                const ASTContext& argContext) {
    // Clocking event expressions are only used in special system function calls,
    // where they don't actually pass any time but instead tell the function which
    // clock to use. We don't want usage inside of an always_comb to report an error
    // about passing time, so clear out the context's procedure to avoid that.
    ASTContext context(argContext);
    context.clearInstanceAndProc();
    context.flags |= ASTFlags::NonProcedural;

    auto& comp = context.getCompilation();
    auto& timing = TimingControl::bind(*syntax.event, context);

    if (syntax.expr)
        context.addDiag(diag::UnexpectedClockingExpr, syntax.expr->sourceRange());

    return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, syntax.sourceRange());
}